

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

size_t xemmai::t_type_of<xemmai::t_list>::f_do_set_at(t_object *a_this,t_pvalue *a_stack)

{
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  anon_class_16_2_47b0d7ab local_28;
  t_pvalue *a_stack_local;
  
  a_stack_local = a_stack;
  f_check<long>(a_stack[2].super_t_pointer.v_p,L"index");
  local_28.list = (t_list *)a_this->v_data;
  local_28.a_stack = &a_stack_local;
  if (*(long *)a_this->v_data == *(long *)(in_FS_OFFSET + -0x68)) {
    f_do_set_at::anon_class_16_2_47b0d7ab::operator()(&local_28);
  }
  else {
    if (*(long *)a_this->v_data != 0) {
      a_message._M_str = L"owned by another thread.";
      a_message._M_len = 0x18;
      f_throw(a_message);
    }
    std::__shared_mutex_pthread::lock
              ((__shared_mutex_pthread *)&((pthread_rwlock_t *)(a_this->v_data + 8))->__data);
    if (*(long *)a_this->v_data != 0) {
      a_message_00._M_str = L"owned by another thread.";
      a_message_00._M_len = 0x18;
      f_throw(a_message_00);
    }
    f_do_set_at::anon_class_16_2_47b0d7ab::operator()(&local_28);
    pthread_rwlock_unlock((pthread_rwlock_t *)(a_this->v_data + 8));
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_list>::f_do_set_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<intptr_t>(a_stack[2], L"index");
	auto& list = a_this->f_as<t_list>();
	list.f_owned_or_shared<std::lock_guard>([&]
	{
		a_stack[0] = list[f_as<intptr_t>(a_stack[2])] = a_stack[3];
	});
	return -1;
}